

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

UnknownField __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,Arena *arena)

{
  ulong uVar1;
  anon_union_8_5_75b44293_for_data_ args;
  UnknownField UVar2;
  
  uVar1._0_4_ = this->number_;
  uVar1._4_4_ = this->type_;
  if (uVar1 >> 0x20 == 4) {
    args.group_ = Arena::CreateArenaCompatible<google::protobuf::UnknownFieldSet>(arena);
    UnknownFieldSet::MergeFrom(args.group_,(this->data_).group_);
  }
  else {
    args = (anon_union_8_5_75b44293_for_data_)(this->data_).string_value;
    if (uVar1._4_4_ == 3) {
      args.string_value =
           Arena::Create<std::__cxx11::string,std::__cxx11::string&>(arena,args.string_value);
    }
  }
  UVar2.data_.varint_ = args.varint_;
  UVar2.number_ = (undefined4)uVar1;
  UVar2.type_ = uVar1._4_4_;
  return UVar2;
}

Assistant:

UnknownField UnknownField::DeepCopy(Arena* arena) const {
  UnknownField copy = *this;
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      copy.data_.string_value =
          Arena::Create<std::string>(arena, *data_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = Arena::Create<UnknownFieldSet>(arena);
      group->MergeFrom(*data_.group_);
      copy.data_.group_ = group;
      break;
    }
    default:
      break;
  }
  return copy;
}